

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void __thiscall
WrappedArgsParser::WrappedArgsParser(WrappedArgsParser *this,string *pname,group *sel)

{
  parameter *ppVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  char (*in_RCX) [10];
  _Alloc_hider _Var6;
  parameter local_580;
  parameter *local_480;
  group *local_478;
  parameter *local_470;
  undefined1 *local_468 [2];
  undefined1 local_458 [16];
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  undefined1 *local_428 [2];
  undefined1 local_418 [16];
  group local_408;
  group local_3c0;
  group local_378;
  parameter local_330;
  parameter local_230;
  parameter local_130;
  
  (this->program_name)._M_dataplus._M_p = (pointer)&(this->program_name).field_2;
  pcVar5 = (pname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar5,pcVar5 + pname->_M_string_length);
  local_478 = &this->selection_options;
  clipp::group::group(local_478,sel);
  clipp::option<char_const(&)[3],char_const(&)[10]>
            (&local_580,(clipp *)"-v",(char (*) [3])"--version",in_RCX);
  local_428[0] = local_418;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_428,"shows version information","");
  ppVar1 = &this->version;
  std::__cxx11::string::operator=((string *)&local_580,(string *)local_428);
  paVar2 = &(this->version).super_token<clipp::parameter>.doc_.field_2;
  (this->version).super_token<clipp::parameter>.doc_._M_dataplus._M_p = (pointer)paVar2;
  paVar3 = &local_580.super_token<clipp::parameter>.doc_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.super_token<clipp::parameter>.doc_._M_dataplus._M_p == paVar3) {
    paVar2->_M_allocated_capacity =
         CONCAT71(local_580.super_token<clipp::parameter>.doc_.field_2._M_allocated_capacity._1_7_,
                  local_580.super_token<clipp::parameter>.doc_.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(this->version).super_token<clipp::parameter>.doc_.field_2 + 8) =
         local_580.super_token<clipp::parameter>.doc_.field_2._8_8_;
  }
  else {
    (ppVar1->super_token<clipp::parameter>).doc_._M_dataplus._M_p =
         local_580.super_token<clipp::parameter>.doc_._M_dataplus._M_p;
    paVar2->_M_allocated_capacity =
         CONCAT71(local_580.super_token<clipp::parameter>.doc_.field_2._M_allocated_capacity._1_7_,
                  local_580.super_token<clipp::parameter>.doc_.field_2._M_local_buf[0]);
  }
  (this->version).super_token<clipp::parameter>.doc_._M_string_length =
       local_580.super_token<clipp::parameter>.doc_._M_string_length;
  local_580.super_token<clipp::parameter>.doc_._M_string_length = 0;
  local_580.super_token<clipp::parameter>.doc_.field_2._M_local_buf[0] = '\0';
  (this->version).super_token<clipp::parameter>.repeatable_ =
       local_580.super_token<clipp::parameter>.repeatable_;
  (this->version).super_token<clipp::parameter>.blocking_ =
       local_580.super_token<clipp::parameter>.blocking_;
  (this->version).super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_580.super_action_provider<clipp::parameter>.argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->version).super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_580.super_action_provider<clipp::parameter>.argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->version).super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_580.super_action_provider<clipp::parameter>.argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->version).super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_580.super_action_provider<clipp::parameter>.repeatActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->version).super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_580.super_action_provider<clipp::parameter>.repeatActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->version).super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_580.super_action_provider<clipp::parameter>.repeatActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->version).super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_580.super_action_provider<clipp::parameter>.missingActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->version).super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_580.super_action_provider<clipp::parameter>.missingActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->version).super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_580.super_action_provider<clipp::parameter>.missingActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->version).super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_580.super_action_provider<clipp::parameter>.blockedActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->version).super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_580.super_action_provider<clipp::parameter>.blockedActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->version).super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_580.super_action_provider<clipp::parameter>.blockedActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->version).super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_580.super_action_provider<clipp::parameter>.conflictActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->version).super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_580.super_action_provider<clipp::parameter>.conflictActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->version).super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_580.super_action_provider<clipp::parameter>.conflictActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->version).flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_580.flags_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->version).flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_580.flags_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->version).flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_580.flags_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->version).matcher_.super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined8 *)&(this->version).matcher_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->version).matcher_.super__Function_base._M_functor + 8) = 0;
  (this->version).matcher_._M_invoker = local_580.matcher_._M_invoker;
  if (local_580.matcher_.super__Function_base._M_manager != (_Manager_type)0x0) {
    *(void **)&(this->version).matcher_.super__Function_base._M_functor =
         local_580.matcher_.super__Function_base._M_functor._M_unused._M_object;
    *(undefined8 *)((long)&(this->version).matcher_.super__Function_base._M_functor + 8) =
         local_580.matcher_.super__Function_base._M_functor._8_8_;
    (this->version).matcher_.super__Function_base._M_manager =
         local_580.matcher_.super__Function_base._M_manager;
    local_580.matcher_.super__Function_base._M_manager = (_Manager_type)0x0;
    local_580.matcher_._M_invoker = (_Invoker_type)0x0;
  }
  paVar2 = &(this->version).label_.field_2;
  (this->version).label_._M_dataplus._M_p = (pointer)paVar2;
  paVar4 = &local_580.label_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.label_._M_dataplus._M_p == paVar4) {
    paVar2->_M_allocated_capacity =
         CONCAT71(local_580.label_.field_2._M_allocated_capacity._1_7_,
                  local_580.label_.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(this->version).label_.field_2 + 8) = local_580.label_.field_2._8_8_;
  }
  else {
    (this->version).label_._M_dataplus._M_p = local_580.label_._M_dataplus._M_p;
    (this->version).label_.field_2._M_allocated_capacity =
         CONCAT71(local_580.label_.field_2._M_allocated_capacity._1_7_,
                  local_580.label_.field_2._M_local_buf[0]);
  }
  (this->version).label_._M_string_length = local_580.label_._M_string_length;
  local_580.label_._M_string_length = 0;
  local_580.label_.field_2._M_local_buf[0] = '\0';
  (this->version).required_ = local_580.required_;
  (this->version).greedy_ = local_580.greedy_;
  _Var6._M_p = local_580.label_._M_dataplus._M_p;
  local_580.super_token<clipp::parameter>.doc_._M_dataplus._M_p = (pointer)paVar3;
  local_580.label_._M_dataplus._M_p = (pointer)paVar4;
  local_470 = ppVar1;
  if (local_428[0] != local_418) {
    operator_delete(local_428[0]);
  }
  clipp::parameter::~parameter(&local_580);
  clipp::option<char_const(&)[3],char_const(&)[7]>
            (&local_580,(clipp *)"-h",(char (*) [3])"--help",(char (*) [7])_Var6._M_p);
  local_448[0] = local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"shows this help message","");
  ppVar1 = &this->help;
  std::__cxx11::string::operator=((string *)&local_580,(string *)local_448);
  paVar2 = &(this->help).super_token<clipp::parameter>.doc_.field_2;
  (this->help).super_token<clipp::parameter>.doc_._M_dataplus._M_p = (pointer)paVar2;
  paVar3 = &local_580.super_token<clipp::parameter>.doc_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.super_token<clipp::parameter>.doc_._M_dataplus._M_p == paVar3) {
    paVar2->_M_allocated_capacity =
         CONCAT71(local_580.super_token<clipp::parameter>.doc_.field_2._M_allocated_capacity._1_7_,
                  local_580.super_token<clipp::parameter>.doc_.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(this->help).super_token<clipp::parameter>.doc_.field_2 + 8) =
         local_580.super_token<clipp::parameter>.doc_.field_2._8_8_;
  }
  else {
    (ppVar1->super_token<clipp::parameter>).doc_._M_dataplus._M_p =
         local_580.super_token<clipp::parameter>.doc_._M_dataplus._M_p;
    paVar2->_M_allocated_capacity =
         CONCAT71(local_580.super_token<clipp::parameter>.doc_.field_2._M_allocated_capacity._1_7_,
                  local_580.super_token<clipp::parameter>.doc_.field_2._M_local_buf[0]);
  }
  (this->help).super_token<clipp::parameter>.doc_._M_string_length =
       local_580.super_token<clipp::parameter>.doc_._M_string_length;
  local_580.super_token<clipp::parameter>.doc_._M_string_length = 0;
  local_580.super_token<clipp::parameter>.doc_.field_2._M_local_buf[0] = '\0';
  (this->help).super_token<clipp::parameter>.repeatable_ =
       local_580.super_token<clipp::parameter>.repeatable_;
  (this->help).super_token<clipp::parameter>.blocking_ =
       local_580.super_token<clipp::parameter>.blocking_;
  (this->help).super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_580.super_action_provider<clipp::parameter>.argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->help).super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_580.super_action_provider<clipp::parameter>.argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->help).super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_580.super_action_provider<clipp::parameter>.argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->help).super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_580.super_action_provider<clipp::parameter>.repeatActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->help).super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_580.super_action_provider<clipp::parameter>.repeatActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->help).super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_580.super_action_provider<clipp::parameter>.repeatActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->help).super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_580.super_action_provider<clipp::parameter>.missingActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->help).super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_580.super_action_provider<clipp::parameter>.missingActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->help).super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_580.super_action_provider<clipp::parameter>.missingActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->help).super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_580.super_action_provider<clipp::parameter>.blockedActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->help).super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_580.super_action_provider<clipp::parameter>.blockedActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->help).super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_580.super_action_provider<clipp::parameter>.blockedActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->help).super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_580.super_action_provider<clipp::parameter>.conflictActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->help).super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_580.super_action_provider<clipp::parameter>.conflictActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->help).super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_580.super_action_provider<clipp::parameter>.conflictActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->help).flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_580.flags_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->help).flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_580.flags_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->help).flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_580.flags_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->help).matcher_.super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined8 *)&(this->help).matcher_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->help).matcher_.super__Function_base._M_functor + 8) = 0;
  (this->help).matcher_._M_invoker = local_580.matcher_._M_invoker;
  if (local_580.matcher_.super__Function_base._M_manager != (_Manager_type)0x0) {
    *(void **)&(this->help).matcher_.super__Function_base._M_functor =
         local_580.matcher_.super__Function_base._M_functor._M_unused._M_object;
    *(undefined8 *)((long)&(this->help).matcher_.super__Function_base._M_functor + 8) =
         local_580.matcher_.super__Function_base._M_functor._8_8_;
    (this->help).matcher_.super__Function_base._M_manager =
         local_580.matcher_.super__Function_base._M_manager;
    local_580.matcher_.super__Function_base._M_manager = (_Manager_type)0x0;
    local_580.matcher_._M_invoker = (_Invoker_type)0x0;
  }
  paVar2 = &(this->help).label_.field_2;
  (this->help).label_._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.label_._M_dataplus._M_p == paVar4) {
    paVar2->_M_allocated_capacity =
         CONCAT71(local_580.label_.field_2._M_allocated_capacity._1_7_,
                  local_580.label_.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(this->help).label_.field_2 + 8) = local_580.label_.field_2._8_8_;
  }
  else {
    (this->help).label_._M_dataplus._M_p = local_580.label_._M_dataplus._M_p;
    (this->help).label_.field_2._M_allocated_capacity =
         CONCAT71(local_580.label_.field_2._M_allocated_capacity._1_7_,
                  local_580.label_.field_2._M_local_buf[0]);
  }
  (this->help).label_._M_string_length = local_580.label_._M_string_length;
  local_580.label_._M_string_length = 0;
  local_580.label_.field_2._M_local_buf[0] = '\0';
  (this->help).required_ = local_580.required_;
  (this->help).greedy_ = local_580.greedy_;
  _Var6._M_p = local_580.label_._M_dataplus._M_p;
  local_580.super_token<clipp::parameter>.doc_._M_dataplus._M_p = (pointer)paVar3;
  local_580.label_._M_dataplus._M_p = (pointer)paVar4;
  local_480 = ppVar1;
  if (local_448[0] != local_438) {
    operator_delete(local_448[0]);
  }
  clipp::parameter::~parameter(&local_580);
  clipp::option<char_const(&)[3],char_const(&)[7]>
            (&local_580,(clipp *)"-i",(char (*) [3])"--info",(char (*) [7])_Var6._M_p);
  local_468[0] = local_458;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_468,"outputs the current session info","");
  std::__cxx11::string::operator=((string *)&local_580,(string *)local_468);
  ppVar1 = local_480;
  paVar2 = &(this->info).super_token<clipp::parameter>.doc_.field_2;
  (this->info).super_token<clipp::parameter>.doc_._M_dataplus._M_p = (pointer)paVar2;
  paVar3 = &local_580.super_token<clipp::parameter>.doc_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.super_token<clipp::parameter>.doc_._M_dataplus._M_p == paVar3) {
    paVar2->_M_allocated_capacity =
         CONCAT71(local_580.super_token<clipp::parameter>.doc_.field_2._M_allocated_capacity._1_7_,
                  local_580.super_token<clipp::parameter>.doc_.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(this->info).super_token<clipp::parameter>.doc_.field_2 + 8) =
         local_580.super_token<clipp::parameter>.doc_.field_2._8_8_;
  }
  else {
    (this->info).super_token<clipp::parameter>.doc_._M_dataplus._M_p =
         local_580.super_token<clipp::parameter>.doc_._M_dataplus._M_p;
    paVar2->_M_allocated_capacity =
         CONCAT71(local_580.super_token<clipp::parameter>.doc_.field_2._M_allocated_capacity._1_7_,
                  local_580.super_token<clipp::parameter>.doc_.field_2._M_local_buf[0]);
  }
  (this->info).super_token<clipp::parameter>.doc_._M_string_length =
       local_580.super_token<clipp::parameter>.doc_._M_string_length;
  local_580.super_token<clipp::parameter>.doc_._M_string_length = 0;
  local_580.super_token<clipp::parameter>.doc_.field_2._M_local_buf[0] = '\0';
  (this->info).super_token<clipp::parameter>.repeatable_ =
       local_580.super_token<clipp::parameter>.repeatable_;
  (this->info).super_token<clipp::parameter>.blocking_ =
       local_580.super_token<clipp::parameter>.blocking_;
  (this->info).super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_580.super_action_provider<clipp::parameter>.argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->info).super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_580.super_action_provider<clipp::parameter>.argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->info).super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_580.super_action_provider<clipp::parameter>.argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_580.super_action_provider<clipp::parameter>.repeatActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->info).super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_580.super_action_provider<clipp::parameter>.repeatActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->info).super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_580.super_action_provider<clipp::parameter>.repeatActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_580.super_action_provider<clipp::parameter>.missingActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->info).super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_580.super_action_provider<clipp::parameter>.missingActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->info).super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_580.super_action_provider<clipp::parameter>.missingActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_580.super_action_provider<clipp::parameter>.blockedActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->info).super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_580.super_action_provider<clipp::parameter>.blockedActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->info).super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_580.super_action_provider<clipp::parameter>.blockedActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_580.super_action_provider<clipp::parameter>.conflictActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->info).super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_580.super_action_provider<clipp::parameter>.conflictActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->info).super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_580.super_action_provider<clipp::parameter>.conflictActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_580.flags_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->info).flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_580.flags_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->info).flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_580.flags_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_580.flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580.flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).matcher_.super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined8 *)&(this->info).matcher_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->info).matcher_.super__Function_base._M_functor + 8) = 0;
  (this->info).matcher_._M_invoker = local_580.matcher_._M_invoker;
  if (local_580.matcher_.super__Function_base._M_manager != (_Manager_type)0x0) {
    *(void **)&(this->info).matcher_.super__Function_base._M_functor =
         local_580.matcher_.super__Function_base._M_functor._M_unused._M_object;
    *(undefined8 *)((long)&(this->info).matcher_.super__Function_base._M_functor + 8) =
         local_580.matcher_.super__Function_base._M_functor._8_8_;
    (this->info).matcher_.super__Function_base._M_manager =
         local_580.matcher_.super__Function_base._M_manager;
    local_580.matcher_.super__Function_base._M_manager = (_Manager_type)0x0;
    local_580.matcher_._M_invoker = (_Invoker_type)0x0;
  }
  paVar2 = &(this->info).label_.field_2;
  (this->info).label_._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.label_._M_dataplus._M_p == paVar4) {
    paVar2->_M_allocated_capacity =
         CONCAT71(local_580.label_.field_2._M_allocated_capacity._1_7_,
                  local_580.label_.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(this->info).label_.field_2 + 8) = local_580.label_.field_2._8_8_;
  }
  else {
    (this->info).label_._M_dataplus._M_p = local_580.label_._M_dataplus._M_p;
    (this->info).label_.field_2._M_allocated_capacity =
         CONCAT71(local_580.label_.field_2._M_allocated_capacity._1_7_,
                  local_580.label_.field_2._M_local_buf[0]);
  }
  (this->info).label_._M_string_length = local_580.label_._M_string_length;
  local_580.label_._M_string_length = 0;
  local_580.label_.field_2._M_local_buf[0] = '\0';
  (this->info).required_ = local_580.required_;
  (this->info).greedy_ = local_580.greedy_;
  local_580.super_token<clipp::parameter>.doc_._M_dataplus._M_p = (pointer)paVar3;
  local_580.label_._M_dataplus._M_p = (pointer)paVar4;
  if (local_468[0] != local_458) {
    operator_delete(local_468[0]);
  }
  clipp::parameter::~parameter(&local_580);
  clipp::parameter::parameter(&local_130,ppVar1);
  clipp::parameter::parameter(&local_230,local_470);
  clipp::operator|(&local_3c0,&local_130,&local_230);
  clipp::parameter::parameter(&local_330,&this->info);
  clipp::operator|(&local_378,&local_3c0,&local_330);
  clipp::group::group(&local_408,local_478);
  clipp::operator|(&this->wrapper_cli,&local_378,&local_408);
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::~vector(&local_408.children_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408.super_token<clipp::group>.doc_._M_dataplus._M_p !=
      &local_408.super_token<clipp::group>.doc_.field_2) {
    operator_delete(local_408.super_token<clipp::group>.doc_._M_dataplus._M_p);
  }
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::~vector(&local_378.children_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378.super_token<clipp::group>.doc_._M_dataplus._M_p !=
      &local_378.super_token<clipp::group>.doc_.field_2) {
    operator_delete(local_378.super_token<clipp::group>.doc_._M_dataplus._M_p);
  }
  clipp::parameter::~parameter(&local_330);
  std::
  vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ::~vector(&local_3c0.children_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.super_token<clipp::group>.doc_._M_dataplus._M_p !=
      &local_3c0.super_token<clipp::group>.doc_.field_2) {
    operator_delete(local_3c0.super_token<clipp::group>.doc_._M_dataplus._M_p);
  }
  clipp::parameter::~parameter(&local_230);
  clipp::parameter::~parameter(&local_130);
  return;
}

Assistant:

WrappedArgsParser(const std::string& pname, const group& sel) noexcept
      : program_name(pname), selection_options(sel) {}